

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O2

double sqrt(double __x)

{
  HighsCDouble *in_RDI;
  double dVar1;
  double dVar2;
  HighsCDouble HVar3;
  
  dVar1 = in_RDI->hi + in_RDI->lo;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    HVar3 = HighsCDouble::operator/(in_RDI,dVar1);
    dVar2 = (dVar1 + HVar3.hi) * 0.5;
  }
  return dVar2;
}

Assistant:

HighsCDouble sqrt(const HighsCDouble& v) {
    double c = std::sqrt(v.hi + v.lo);

    // guard against division by zero
    if (c == 0.0) return 0.0;

    // calculate precise square root by newton step
    HighsCDouble res = v / c;
    res += c;
    // multiplication by 0.5 is exact
    res.hi *= 0.5;
    res.lo *= 0.5;
    return res;
  }